

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

bool __thiscall IMLE::loadParameters(IMLE *this,string *fname)

{
  byte bVar1;
  istream *is;
  Param *in_RDI;
  nvp<IMLE::Param> nVar2;
  xml_iarchive ia;
  ifstream ifs;
  Param newParams;
  Param *in_stack_fffffffffffffc18;
  IMLE *in_stack_fffffffffffffc20;
  xml_iarchive *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  Param *in_stack_fffffffffffffc58;
  IMLE *in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  Param *in_stack_fffffffffffffc70;
  string local_318 [32];
  string local_2f8 [48];
  undefined1 local_2c8 [711];
  byte local_1;
  
  Param::Param(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
  is = (istream *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_2c8,is,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc60);
    std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
    message(in_stack_fffffffffffffc20,(string *)in_stack_fffffffffffffc18);
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::string::~string(local_318);
    local_1 = 0;
  }
  else {
    boost::archive::xml_iarchive::xml_iarchive
              (in_stack_fffffffffffffc40,is,(uint)((ulong)in_RDI >> 0x20));
    nVar2 = boost::serialization::make_nvp<IMLE::Param>
                      ((char *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
              ((interface_iarchive<boost::archive::xml_iarchive> *)nVar2.n_,
               (nvp<IMLE::Param> *)nVar2.v_);
    std::ifstream::close();
    setParameters(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    local_1 = 1;
    boost::archive::xml_iarchive::~xml_iarchive((xml_iarchive *)0x2f9704);
  }
  std::ifstream::~ifstream(local_2c8);
  Param::~Param(in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::loadParameters(std::string const &fname)
{
#ifdef IMLE_NO_TEMPLATES
    Param newParams(d,D);
#else
    Param newParams;
#endif

    std::ifstream ifs(fname.c_str());
    	if( !ifs.is_open() )
	{
		message(OPENERR + fname + "!!");
		return false;
	}

    assert(ifs.good());
    boost::archive::xml_iarchive ia(ifs);
    ia & BOOST_SERIALIZATION_NVP(newParams);
    ifs.close();

    setParameters(newParams);

	return true;
}